

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O3

REF_STATUS ref_node_remove_without_global(REF_NODE ref_node,REF_INT node)

{
  int iVar1;
  REF_GLOB *pRVar2;
  REF_INT *pRVar3;
  uint uVar4;
  undefined8 in_RAX;
  ulong uVar5;
  long lVar6;
  long lVar7;
  REF_INT location;
  int local_24;
  
  local_24 = (int)((ulong)in_RAX >> 0x20);
  uVar4 = 3;
  if ((-1 < node) && (node < ref_node->max)) {
    if (-1 < ref_node->global[(uint)node]) {
      uVar4 = ref_sort_search_glob
                        (ref_node->n,ref_node->sorted_global,ref_node->global[(uint)node],&local_24)
      ;
      if (uVar4 == 0) {
        lVar6 = (long)local_24;
        iVar1 = ref_node->n;
        uVar4 = iVar1 - 1;
        uVar5 = (ulong)uVar4;
        if (local_24 < (int)uVar4) {
          pRVar2 = ref_node->sorted_global;
          lVar7 = lVar6 + 1;
          do {
            pRVar2[lVar7 + -1] = pRVar2[lVar7];
            lVar7 = lVar7 + 1;
          } while (iVar1 != lVar7);
          if (local_24 < (int)uVar4) {
            pRVar3 = ref_node->sorted_local;
            do {
              pRVar3[lVar6] = pRVar3[lVar6 + 1];
              lVar6 = lVar6 + 1;
              uVar5 = (long)ref_node->n - 1;
            } while (lVar6 < (long)uVar5);
          }
        }
        ref_node->global[(uint)node] = (long)ref_node->blank;
        ref_node->blank = -2 - node;
        ref_node->n = (REF_INT)uVar5;
        uVar4 = 0;
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",
               0x1d4,"ref_node_remove_without_global",(ulong)uVar4,"find global in sort list");
      }
    }
  }
  return uVar4;
}

Assistant:

REF_FCN REF_STATUS ref_node_remove_without_global(REF_NODE ref_node,
                                                  REF_INT node) {
  REF_INT location, sorted_node;
  if (!ref_node_valid(ref_node, node)) return REF_INVALID;

  RSS(ref_sort_search_glob(ref_node_n(ref_node), ref_node->sorted_global,
                           ref_node->global[node], &location),
      "find global in sort list");

  for (sorted_node = location; sorted_node < ref_node_n(ref_node) - 1;
       sorted_node++)
    ref_node->sorted_global[sorted_node] =
        ref_node->sorted_global[sorted_node + 1];
  for (sorted_node = location; sorted_node < ref_node_n(ref_node) - 1;
       sorted_node++)
    ref_node->sorted_local[sorted_node] =
        ref_node->sorted_local[sorted_node + 1];

  ref_node->global[node] = ref_node->blank;
  ref_node->blank = index2next(node);

  (ref_node->n)--;

  return REF_SUCCESS;
}